

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c74_mock_clock.h
# Opt level: O2

void __thiscall c74::mock::clock::tick(clock *this)

{
  multiset<c74::mock::clock::event,_std::less<c74::mock::clock::event>,_std::allocator<c74::mock::clock::event>_>
  *this_00;
  __atomic_flag_data_type _Var1;
  pointer peVar2;
  key_type *pkVar3;
  long lVar4;
  _Base_ptr p_Var5;
  multiset<c74::mock::clock::event,_std::less<c74::mock::clock::event>,_std::allocator<c74::mock::clock::event>_>
  *__range3;
  event *e;
  key_type *__x;
  pointer peVar6;
  unique_lock<std::mutex> pending_lock;
  vector<c74::mock::clock::event,_std::allocator<c74::mock::clock::event>_> events_that_ran;
  unique_lock<std::mutex> scheduled_lock;
  unique_lock<std::mutex> uStack_88;
  _Vector_base<c74::mock::clock::event,_std::allocator<c74::mock::clock::event>_> local_78;
  condition_variable *local_60;
  mutex *local_58;
  mutex *local_50;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_48;
  unique_lock<std::mutex> local_40;
  
  local_50 = &this->pending_events_mutex;
  local_58 = &this->scheduled_events_mutex;
  this_00 = &this->scheduled_events;
  local_60 = &this->cv;
  while( true ) {
    LOCK();
    _Var1 = (this->run_thread).super___atomic_flag_base._M_i;
    (this->run_thread).super___atomic_flag_base._M_i = true;
    UNLOCK();
    if (_Var1 == false) break;
    std::unique_lock<std::mutex>::unique_lock(&uStack_88,local_50);
    std::unique_lock<std::mutex>::unique_lock(&local_40,local_58);
    peVar2 = (this->pending_events).
             super__Vector_base<c74::mock::clock::event,_std::allocator<c74::mock::clock::event>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (peVar6 = (this->pending_events).
                  super__Vector_base<c74::mock::clock::event,_std::allocator<c74::mock::clock::event>_>
                  ._M_impl.super__Vector_impl_data._M_start; peVar6 != peVar2; peVar6 = peVar6 + 1)
    {
      std::
      _Rb_tree<c74::mock::clock::event,c74::mock::clock::event,std::_Identity<c74::mock::clock::event>,std::less<c74::mock::clock::event>,std::allocator<c74::mock::clock::event>>
      ::_M_insert_equal<c74::mock::clock::event_const&>
                ((_Rb_tree<c74::mock::clock::event,c74::mock::clock::event,std::_Identity<c74::mock::clock::event>,std::less<c74::mock::clock::event>,std::allocator<c74::mock::clock::event>>
                  *)this_00,peVar6);
    }
    peVar6 = (this->pending_events).
             super__Vector_base<c74::mock::clock::event,_std::allocator<c74::mock::clock::event>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->pending_events).
        super__Vector_base<c74::mock::clock::event,_std::allocator<c74::mock::clock::event>_>.
        _M_impl.super__Vector_impl_data._M_finish != peVar6) {
      (this->pending_events).
      super__Vector_base<c74::mock::clock::event,_std::allocator<c74::mock::clock::event>_>._M_impl.
      super__Vector_impl_data._M_finish = peVar6;
    }
    std::unique_lock<std::mutex>::unlock(&uStack_88);
    local_78._M_impl.super__Vector_impl_data._M_start = (key_type *)0x0;
    local_78._M_impl.super__Vector_impl_data._M_finish = (key_type *)0x0;
    local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (p_Var5 = (this->scheduled_events)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (__x = local_78._M_impl.super__Vector_impl_data._M_start,
        pkVar3 = local_78._M_impl.super__Vector_impl_data._M_finish,
        (_Rb_tree_header *)p_Var5 != &(this->scheduled_events)._M_t._M_impl.super__Rb_tree_header &&
        (lVar4 = std::chrono::_V2::steady_clock::now(),
        __x = local_78._M_impl.super__Vector_impl_data._M_start,
        pkVar3 = local_78._M_impl.super__Vector_impl_data._M_finish, *(long *)(p_Var5 + 1) <= lVar4)
        ); p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
      std::vector<c74::mock::clock::event,_std::allocator<c74::mock::clock::event>_>::push_back
                ((vector<c74::mock::clock::event,_std::allocator<c74::mock::clock::event>_> *)
                 &local_78,(value_type *)(p_Var5 + 1));
      (*(code *)p_Var5[1]._M_parent)(p_Var5[1]._M_left);
    }
    for (; __x != pkVar3; __x = __x + 1) {
      std::
      _Rb_tree<c74::mock::clock::event,_c74::mock::clock::event,_std::_Identity<c74::mock::clock::event>,_std::less<c74::mock::clock::event>,_std::allocator<c74::mock::clock::event>_>
      ::erase(&this_00->_M_t,__x);
    }
    std::unique_lock<std::mutex>::lock(&uStack_88);
    peVar2 = (this->pending_events).
             super__Vector_base<c74::mock::clock::event,_std::allocator<c74::mock::clock::event>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (peVar6 = (this->pending_events).
                  super__Vector_base<c74::mock::clock::event,_std::allocator<c74::mock::clock::event>_>
                  ._M_impl.super__Vector_impl_data._M_start; peVar6 != peVar2; peVar6 = peVar6 + 1)
    {
      std::
      _Rb_tree<c74::mock::clock::event,c74::mock::clock::event,std::_Identity<c74::mock::clock::event>,std::less<c74::mock::clock::event>,std::allocator<c74::mock::clock::event>>
      ::_M_insert_equal<c74::mock::clock::event_const&>
                ((_Rb_tree<c74::mock::clock::event,c74::mock::clock::event,std::_Identity<c74::mock::clock::event>,std::less<c74::mock::clock::event>,std::allocator<c74::mock::clock::event>>
                  *)this_00,peVar6);
    }
    peVar6 = (this->pending_events).
             super__Vector_base<c74::mock::clock::event,_std::allocator<c74::mock::clock::event>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->pending_events).
        super__Vector_base<c74::mock::clock::event,_std::allocator<c74::mock::clock::event>_>.
        _M_impl.super__Vector_impl_data._M_finish != peVar6) {
      (this->pending_events).
      super__Vector_base<c74::mock::clock::event,_std::allocator<c74::mock::clock::event>_>._M_impl.
      super__Vector_impl_data._M_finish = peVar6;
    }
    if ((this->scheduled_events)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
      lVar4 = std::chrono::_V2::steady_clock::now();
      local_48.__d.__r = (duration)(lVar4 + 3600000000000);
    }
    else {
      local_48.__d.__r =
           *(duration *)
            ((this->scheduled_events)._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1);
    }
    std::unique_lock<std::mutex>::unlock(&local_40);
    std::condition_variable::
    __wait_until_impl<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
              (local_60,&uStack_88,&local_48);
    std::_Vector_base<c74::mock::clock::event,_std::allocator<c74::mock::clock::event>_>::
    ~_Vector_base(&local_78);
    std::unique_lock<std::mutex>::~unique_lock(&local_40);
    std::unique_lock<std::mutex>::~unique_lock(&uStack_88);
  }
  return;
}

Assistant:

void tick() {
			while (run_thread.test_and_set()) {
#ifdef WIN_VERSION
				// On Windows an exception will be thrown when we try to lock the mutex wihout some sort of time passage
				// (either a console post or an explicit short delay)
				// std::cout << c74::mock::clock::tick()" << std::endl;
				std::this_thread::sleep_for(1ms);
#endif
				std::unique_lock<std::mutex> pending_lock(pending_events_mutex);
				std::unique_lock<std::mutex> scheduled_lock(scheduled_events_mutex);

				// update list of events
				for (auto &e : pending_events)
					scheduled_events.insert(e);
				pending_events.clear();

				// User code can add new events, so don't lock pending_events
				// while calling the scheduled events!
				pending_lock.unlock();

				std::vector<event> events_that_ran;
				for (auto& e : scheduled_events) {
					if (e > now()) {
						//std::cout << time(now()) << " (all remaining events in the future)" << std::endl;
						break;
					}
					//std::cout << time(now()) << " (event to run)" << std::endl;
					events_that_ran.push_back(e);
					e();
				}

				// purge events that have run
				for (auto& e : events_that_ran)
					scheduled_events.erase(e);


				// events themselves may have added new (pending) events
				pending_lock.lock();
				for (auto &e : pending_events)
					scheduled_events.insert(e);
				pending_events.clear();
        
				const auto next = scheduled_events.empty() ? now()+1h : scheduled_events.begin()->onset();
				scheduled_lock.unlock(); // we're not touching any scheduled events anymore. Unlock the scheduled_events_mutex.
				cv.wait_until(pending_lock, next);
			}
        }